

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::InsertFunctionTypeIdCheck
          (Lowerer *this,RegOpnd *funcOpnd,Instr *insertBeforeInstr,BailOutKind bailOutKind,
          BailOutInfo *bailOutInfo)

{
  bool bVar1;
  uint32 uVar2;
  BailOutInstrTemplate<IR::Instr> *this_00;
  IndirOpnd *pIVar3;
  Func *func;
  RegOpnd *baseOpnd;
  Instr *this_01;
  IntConstOpnd *newSrc;
  IntConstOpnd *typeIdFunctionConstOpnd;
  IndirOpnd *functionTypeIdIndirOpnd;
  Instr *instr;
  RegOpnd *functionTypeRegOpnd;
  IndirOpnd *functionTypeIndirOpnd;
  Instr *bailOutIfNotFunction;
  BailOutInfo *bailOutInfo_local;
  BailOutKind bailOutKind_local;
  Instr *insertBeforeInstr_local;
  RegOpnd *funcOpnd_local;
  Lowerer *this_local;
  
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOnNotEqual,bailOutKind,bailOutInfo,bailOutInfo->bailOutFunc);
  uVar2 = Js::RecyclableObject::GetOffsetOfType();
  pIVar3 = IR::IndirOpnd::New(funcOpnd,uVar2,TyUint64,insertBeforeInstr->m_func,false);
  func = Func::GetTopFunc(insertBeforeInstr->m_func);
  baseOpnd = IR::RegOpnd::New(TyVar,func);
  this_01 = IR::Instr::New(Ld_A,&baseOpnd->super_Opnd,&pIVar3->super_Opnd,insertBeforeInstr->m_func)
  ;
  bVar1 = Func::HasByteCodeOffset(this_01->m_func);
  if (bVar1) {
    IR::Instr::SetByteCodeOffset(this_01,insertBeforeInstr);
  }
  IR::Instr::InsertBefore(insertBeforeInstr,this_01);
  uVar2 = Js::Type::GetOffsetOfTypeId();
  pIVar3 = IR::IndirOpnd::New(baseOpnd,uVar2,TyInt32,insertBeforeInstr->m_func,false);
  newSrc = IR::IntConstOpnd::New(0x1b,TyInt32,insertBeforeInstr->m_func,false);
  IR::Instr::SetSrc1(&this_00->super_Instr,&pIVar3->super_Opnd);
  IR::Instr::SetSrc2(&this_00->super_Instr,&newSrc->super_Opnd);
  IR::Instr::InsertBefore(insertBeforeInstr,&this_00->super_Instr);
  return &this_00->super_Instr;
}

Assistant:

IR::Instr*
Lowerer::InsertFunctionTypeIdCheck(IR::RegOpnd * funcOpnd, IR::Instr* insertBeforeInstr, IR::BailOutKind bailOutKind, BailOutInfo *bailOutInfo)
{
    IR::Instr *bailOutIfNotFunction = IR::BailOutInstr::New(Js::OpCode::BailOnNotEqual, bailOutKind, bailOutInfo, bailOutInfo->bailOutFunc);

    // functionTypeRegOpnd = Ld functionRegOpnd->type
    IR::IndirOpnd *functionTypeIndirOpnd = IR::IndirOpnd::New(funcOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, insertBeforeInstr->m_func);
    IR::RegOpnd *functionTypeRegOpnd = IR::RegOpnd::New(TyVar, insertBeforeInstr->m_func->GetTopFunc());
    IR::Instr *instr = IR::Instr::New(Js::OpCode::Ld_A, functionTypeRegOpnd, functionTypeIndirOpnd, insertBeforeInstr->m_func);
    if (instr->m_func->HasByteCodeOffset())
    {
        instr->SetByteCodeOffset(insertBeforeInstr);
    }
    insertBeforeInstr->InsertBefore(instr);

    CompileAssert(sizeof(Js::TypeId) == sizeof(int32));
    // if (functionTypeRegOpnd->typeId != TypeIds_Function) goto $noInlineLabel
    // BrNeq_I4 $noInlineLabel, functionTypeRegOpnd->typeId, TypeIds_Function
    IR::IndirOpnd *functionTypeIdIndirOpnd = IR::IndirOpnd::New(functionTypeRegOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, insertBeforeInstr->m_func);
    IR::IntConstOpnd *typeIdFunctionConstOpnd = IR::IntConstOpnd::New(Js::TypeIds_Function, TyInt32, insertBeforeInstr->m_func);
    bailOutIfNotFunction->SetSrc1(functionTypeIdIndirOpnd);
    bailOutIfNotFunction->SetSrc2(typeIdFunctionConstOpnd);
    insertBeforeInstr->InsertBefore(bailOutIfNotFunction);

    return bailOutIfNotFunction;
}